

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::CallRegExFunction<2>
              (RecyclableObject *fnObj,Var regExp,Arguments *args,ScriptContext *scriptContext)

{
  Var function;
  ThreadContext *this;
  anon_class_40_4_a3bf5f9f local_60;
  ThreadContext *local_38;
  ThreadContext *threadContext;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  Var regExp_local;
  RecyclableObject *fnObj_local;
  
  threadContext = (ThreadContext *)scriptContext;
  scriptContext_local = (ScriptContext *)args;
  args_local = (Arguments *)regExp;
  regExp_local = fnObj;
  if ((SUB84(args->Info,0) & 0xffffff) < 3) {
    fnObj_local = (RecyclableObject *)CallRegExFunction<1>(fnObj,regExp,args,scriptContext);
  }
  else {
    this = ScriptContext::GetThreadContext(scriptContext);
    function = regExp_local;
    local_60.fnObj = (RecyclableObject *)regExp_local;
    local_60.regExp = args_local;
    local_60.threadContext = this;
    local_38 = this;
    Arguments::Arguments(&local_60.args,(Arguments *)scriptContext_local);
    fnObj_local = (RecyclableObject *)
                  ThreadContext::
                  ExecuteImplicitCall<Js::JavascriptString::CallRegExFunction<2>(Js::RecyclableObject*,void*,Js::Arguments&,Js::ScriptContext*)::__0>
                            (this,(RecyclableObject *)function,ImplicitCall_Accessor,&local_60);
  }
  return fnObj_local;
}

Assistant:

Var JavascriptString::CallRegExFunction<2>(RecyclableObject* fnObj, Var regExp, Arguments& args, ScriptContext * scriptContext)
    {
        // args[0]: String
        // args[1]: RegExp (ignored since we need to create one when the argument is "undefined")
        // args[2]: Var

        if (args.Info.Count < 3)
        {
            return CallRegExFunction<1>(fnObj, regExp, args, scriptContext);
        }

        ThreadContext * threadContext = scriptContext->GetThreadContext();
        return threadContext->ExecuteImplicitCall(fnObj, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, fnObj, CallInfo(CallFlags_Value, 3), regExp, args[0], args[2]);
        });
    }